

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O2

bool __thiscall
crnlib::crn_comp::compress_pass(crn_comp *this,crn_comp_params *params,float *pEffective_bitrate)

{
  uint uVar1;
  crn_format cVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint *puVar7;
  ulong uVar8;
  long lVar9;
  
  clear(this);
  if (pEffective_bitrate != (float *)0x0) {
    *pEffective_bitrate = 0.0;
  }
  this->m_pParams = params;
  cVar2 = params->m_format;
  this->m_has_etc_color_blocks = (ulong)(cVar2 + ~cCRNFmtDXT5A) < 5;
  this->m_has_subblocks = cVar2 == cCRNFmtETC2A || (cVar2 & ~cCRNFmtDXT3) == cCRNFmtETC1;
  uVar6 = params->m_width;
  uVar1 = params->m_height;
  uVar3 = uVar1;
  if (uVar6 >= uVar1 && uVar6 != uVar1) {
    uVar3 = uVar6;
  }
  if (uVar6 < uVar1) {
    uVar1 = uVar6;
  }
  bVar4 = false;
  if ((uVar1 != 0) && (bVar4 = false, uVar3 < 0x1001)) {
    iVar5 = task_pool::init(&this->m_task_pool,(EVP_PKEY_CTX *)(ulong)params->m_num_helper_threads);
    if ((char)iVar5 == '\0') {
      bVar4 = false;
    }
    else {
      bVar4 = compress_internal(this);
      task_pool::deinit(&this->m_task_pool);
      if (bVar4 && pEffective_bitrate != (float *)0x0) {
        puVar7 = &this->m_images[0][0].m_height;
        uVar6 = 0;
        for (uVar8 = 0; uVar8 != this->m_pParams->m_faces; uVar8 = uVar8 + 1) {
          for (lVar9 = 0; (ulong)this->m_pParams->m_levels * 0x30 - lVar9 != 0; lVar9 = lVar9 + 0x30
              ) {
            uVar6 = uVar6 + *(int *)((long)puVar7 + lVar9) * *(int *)((long)puVar7 + lVar9 + -4);
          }
          puVar7 = puVar7 + 0xc0;
        }
        *pEffective_bitrate = ((float)(this->m_comp_data).m_size * 8.0) / (float)uVar6;
        bVar4 = true;
      }
    }
  }
  return bVar4;
}

Assistant:

bool crn_comp::compress_pass(const crn_comp_params& params, float* pEffective_bitrate)
    {
        clear();

        if (pEffective_bitrate)
        {
            *pEffective_bitrate = 0.0f;
        }

        m_pParams = &params;
        m_has_etc_color_blocks = params.m_format == cCRNFmtETC1 || params.m_format == cCRNFmtETC2 || params.m_format == cCRNFmtETC2A || params.m_format == cCRNFmtETC1S || params.m_format == cCRNFmtETC2AS;
        m_has_subblocks = params.m_format == cCRNFmtETC1 || params.m_format == cCRNFmtETC2 || params.m_format == cCRNFmtETC2A;

        if ((math::minimum(m_pParams->m_width, m_pParams->m_height) < 1) || (math::maximum(m_pParams->m_width, m_pParams->m_height) > cCRNMaxLevelResolution))
        {
            return false;
        }

        if (!m_task_pool.init(params.m_num_helper_threads))
        {
            return false;
        }

        bool status = compress_internal();

        m_task_pool.deinit();

        if ((status) && (pEffective_bitrate))
        {
            uint total_pixels = 0;

            for (uint f = 0; f < m_pParams->m_faces; f++)
            {
                for (uint l = 0; l < m_pParams->m_levels; l++)
                {
                    total_pixels += m_images[f][l].get_total_pixels();
                }
            }

            *pEffective_bitrate = (m_comp_data.size() * 8.0f) / total_pixels;
        }

        return status;
    }